

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O2

xmlXPathObjectPtr xmlXPtrNewRangeNodes(xmlNodePtr start,xmlNodePtr end)

{
  xmlXPathObjectPtr range;
  
  if (end == (xmlNodePtr)0x0 || start == (xmlNodePtr)0x0) {
    range = (xmlXPathObjectPtr)0x0;
  }
  else {
    range = xmlXPtrNewRangeInternal(start,-1,end,-1);
    xmlXPtrRangeCheckOrder(range);
  }
  return range;
}

Assistant:

xmlXPathObjectPtr
xmlXPtrNewRangeNodes(xmlNodePtr start, xmlNodePtr end) {
    xmlXPathObjectPtr ret;

    if (start == NULL)
	return(NULL);
    if (end == NULL)
	return(NULL);

    ret = xmlXPtrNewRangeInternal(start, -1, end, -1);
    xmlXPtrRangeCheckOrder(ret);
    return(ret);
}